

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_decoder.h
# Opt level: O0

void __thiscall
draco::
MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::MeshPredictionSchemeGeometricNormalDecoder
          (MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,PointAttribute *attribute,
          PredictionSchemeWrapDecodingTransform<int,_int> *transform,
          MeshPredictionSchemeData<draco::CornerTable> *mesh_data)

{
  RAnsBitDecoder *in_RDI;
  MeshPredictionSchemeData<draco::CornerTable> *in_stack_ffffffffffffffb8;
  PointAttribute *in_stack_ffffffffffffffc8;
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *in_stack_ffffffffffffffd0;
  
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ::MeshPredictionSchemeDecoder
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (PredictionSchemeWrapDecodingTransform<int,_int> *)in_RDI,in_stack_ffffffffffffffb8);
  *(undefined ***)&in_RDI->ans_decoder_ = &PTR__MeshPredictionSchemeGeometricNormalDecoder_00273f20;
  MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ::MeshPredictionSchemeGeometricNormalPredictorArea
            ((MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
              *)in_stack_ffffffffffffffd0,
             (MeshPredictionSchemeData<draco::CornerTable> *)(in_RDI + 4));
  OctahedronToolBox::OctahedronToolBox((OctahedronToolBox *)&in_RDI[6].prob_zero_);
  RAnsBitDecoder::RAnsBitDecoder(in_RDI);
  return;
}

Assistant:

MeshPredictionSchemeGeometricNormalDecoder(const PointAttribute *attribute,
                                             const TransformT &transform,
                                             const MeshDataT &mesh_data)
      : MeshPredictionSchemeDecoder<DataTypeT, TransformT, MeshDataT>(
            attribute, transform, mesh_data),
        predictor_(mesh_data) {}